

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O2

Node * __thiscall
dynet::LookupNode::autobatch_pseudo_node
          (LookupNode *this,ComputationGraph *cg,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *batch_ids)

{
  value_type_conflict1 *__x;
  _func_int **pp_Var1;
  LookupNode *this_00;
  _func_int **pp_Var2;
  Node *pNVar3;
  uint *puVar4;
  uint word_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  value_type_conflict1 local_5c;
  ComputationGraph *local_58;
  uint *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = (batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  pNVar3 = (Node *)0x0;
  local_58 = cg;
  for (puVar4 = (batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_start; puVar4 != local_50; puVar4 = puVar4 + 1) {
    pNVar3 = (local_58->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start[*puVar4];
    __x = *(value_type_conflict1 **)((long)pNVar3[1].dim.d + 8);
    if (__x == (value_type_conflict1 *)0x0) {
      pp_Var1 = *(_func_int ***)&(pNVar3[1].device)->device_id;
      for (pp_Var2 = (pNVar3[1].device)->_vptr_Device; pp_Var2 != pp_Var1;
          pp_Var2 = (_func_int **)((long)pp_Var2 + 4)) {
        local_5c = *(value_type_conflict1 *)pp_Var2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_5c);
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__x);
    }
  }
  this_00 = (LookupNode *)operator_new(0xb8);
  LookupNode(this_00,(LookupParameterStorage *)pNVar3[1].cg_,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return (Node *)this_00;
}

Assistant:

Node* LookupNode::autobatch_pseudo_node(const ComputationGraph & cg,
                                        const std::vector<VariableIndex> & batch_ids) const {
  vector<unsigned> ids;
  LookupNode* ln = nullptr;
  for(auto batch_id : batch_ids) {
    ln = static_cast<LookupNode*>(cg.nodes[batch_id]);
    if(ln->pindex != nullptr)
      ids.push_back(*ln->pindex);
    else
      for(auto word_id : *ln->pindices)
        ids.push_back(word_id);
  }
  return new LookupNode(ln->params, ids);
}